

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O3

void __thiscall
estl::vector_s<int,_10UL>::vector_s(vector_s<int,_10UL> *this,initializer_list<int> *init)

{
  int *first;
  size_type sVar1;
  pointer pvVar2;
  size_type sVar3;
  long lVar4;
  
  this->size_ = 0;
  this->data_ptr_ = (pointer)this->data_;
  first = init->_M_array;
  sVar1 = init->_M_len;
  sVar3 = vector_s<int,10ul>::check_range<int_const*>
                    ((vector_s<int,10ul> *)this,first,first + sVar1);
  if (sVar1 != 0) {
    pvVar2 = this->data_ptr_;
    lVar4 = 0;
    do {
      *(undefined4 *)((long)pvVar2 + lVar4) = *(undefined4 *)((long)first + lVar4);
      lVar4 = lVar4 + 4;
    } while (sVar1 << 2 != lVar4);
  }
  this->size_ = sVar3;
  return;
}

Assistant:

vector_s(const std::initializer_list<T>& init)
    {
    //        std::cout << "vector_s(const std::initializer_list<T>& init) constructor this: " << this <<  std::endl;
        auto it = init.begin();
        const auto end = init.end();
        const auto diff = check_range(it, end);
        size_type i = 0u;
        for (; it != end; ++it, ++i) {
            const pointer insert_ptr = data_ptr_ + i;
            new (insert_ptr) value_type(*it); // TODO: Is it OK to move here! Elements are already copied into initializer_list?
        }
        size_ = diff;
    }